

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void Js::CompoundString::PackSubstringInfo
               (CharCount startIndex,CharCount length,void **packedSubstringInfoRef,
               void **packedSubstringInfo2Ref)

{
  code *pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined4 *puVar3;
  undefined8 local_38;
  CharCount unpackedStartIndex;
  CharCount unpackedLength;
  
  local_38 = in_RAX;
  if ((int)startIndex < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x2c4,"(static_cast<int32>(startIndex) >= 0)",
                                "static_cast<int32>(startIndex) >= 0");
    if (!bVar2) goto LAB_00a08bce;
    *puVar3 = 0;
  }
  if ((int)length < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x2c5,"(static_cast<int32>(length) >= 0)",
                                "static_cast<int32>(length) >= 0");
    if (!bVar2) goto LAB_00a08bce;
    *puVar3 = 0;
  }
  if (packedSubstringInfoRef == (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x2c6,"(packedSubstringInfoRef)","packedSubstringInfoRef");
    if (!bVar2) goto LAB_00a08bce;
    *puVar3 = 0;
  }
  if (packedSubstringInfo2Ref == (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x2c7,"(packedSubstringInfo2Ref)","packedSubstringInfo2Ref");
    if (!bVar2) goto LAB_00a08bce;
    *puVar3 = 0;
  }
  *packedSubstringInfoRef = (void *)(((ulong)startIndex << 0x20) + (ulong)length * 2 + 1);
  *packedSubstringInfo2Ref = (void *)0x0;
  UnpackSubstringInfo(*packedSubstringInfoRef,(void *)0x0,(CharCount *)&local_38,
                      (CharCount *)((long)&local_38 + 4));
  if ((CharCount)local_38 != startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x2e9,"(unpackedStartIndex == startIndex)",
                                "unpackedStartIndex == startIndex");
    if (!bVar2) goto LAB_00a08bce;
    *puVar3 = 0;
  }
  if (local_38._4_4_ != length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x2ea,"(unpackedLength == length)","unpackedLength == length");
    if (!bVar2) {
LAB_00a08bce:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void CompoundString::PackSubstringInfo(
        const CharCount startIndex,
        const CharCount length,
        void * *const packedSubstringInfoRef,
        void * *const packedSubstringInfo2Ref)
    {
        Assert(static_cast<int32>(startIndex) >= 0);
        Assert(static_cast<int32>(length) >= 0);
        Assert(packedSubstringInfoRef);
        Assert(packedSubstringInfo2Ref);

    #if defined(TARGET_64)
        // On 64-bit architectures, two nonnegative 32-bit ints fit completely in a tagged pointer
        *packedSubstringInfoRef =
            reinterpret_cast<void *>(
                (static_cast<uintptr_t>(startIndex) << 32) +
                (static_cast<uintptr_t>(length) << 1) +
                1);
        *packedSubstringInfo2Ref = nullptr;
    #else
        CompileAssert(sizeof(void *) == sizeof(int32));

        // On 32-bit architectures, it will be attempted to fit both pieces of into one pointer by using 16 bits for the
        // start index, 15 for the length, and 1 for the tag. If it does not fit, an additional pointer will be used.
        if(startIndex <= static_cast<CharCount>(0xffff) && length <= static_cast<CharCount>(0x7fff))
        {
            *packedSubstringInfoRef =
                reinterpret_cast<void *>(
                    (static_cast<uintptr_t>(startIndex) << 16) +
                    (static_cast<uintptr_t>(length) << 1) +
                    1);
            *packedSubstringInfo2Ref = nullptr;
        }
        else
        {
            *packedSubstringInfoRef = reinterpret_cast<void *>((static_cast<uintptr_t>(startIndex) << 1) + 1);
            *packedSubstringInfo2Ref = reinterpret_cast<void *>((static_cast<uintptr_t>(length) << 1) + 1);
        }
    #endif

    #if DBG
        CharCount unpackedStartIndex, unpackedLength;
        UnpackSubstringInfo(*packedSubstringInfoRef, *packedSubstringInfo2Ref, &unpackedStartIndex, &unpackedLength);
        Assert(unpackedStartIndex == startIndex);
        Assert(unpackedLength == length);
    #endif
    }